

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_events.cpp
# Opt level: O3

FEvent * __thiscall FEventTree::FindEvent(FEventTree *this,double key)

{
  double dVar1;
  FEventTree *pFVar2;
  
  pFVar2 = (FEventTree *)this->Root;
  while( true ) {
    if (pFVar2 == this) {
      return (FEvent *)0x0;
    }
    dVar1 = (pFVar2->Nil).Distance;
    if ((dVar1 == key) && (!NAN(dVar1) && !NAN(key))) break;
    pFVar2 = (FEventTree *)(&(pFVar2->Nil).Left)[dVar1 <= key];
  }
  return &pFVar2->Nil;
}

Assistant:

FEvent *FEventTree::FindEvent (double key) const
{
	FEvent *node = Root;

	while (node != &Nil)
	{
		if (node->Distance == key)
		{
			return node;
		}
		else if (node->Distance > key)
		{
			node = node->Left;
		}
		else
		{
			node = node->Right;
		}
	}
	return NULL;
}